

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signature_algorithm_unittest.cc
# Opt level: O0

void __thiscall
bssl::anon_unknown_0::SignatureAlgorithmTest_ParseDerEcdsaWithSHA384NoParams_Test::
~SignatureAlgorithmTest_ParseDerEcdsaWithSHA384NoParams_Test
          (SignatureAlgorithmTest_ParseDerEcdsaWithSHA384NoParams_Test *this)

{
  SignatureAlgorithmTest_ParseDerEcdsaWithSHA384NoParams_Test *this_local;
  
  ~SignatureAlgorithmTest_ParseDerEcdsaWithSHA384NoParams_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(SignatureAlgorithmTest, ParseDerEcdsaWithSHA384NoParams) {
  // clang-format off
  const uint8_t kData[] = {
      0x30, 0x0A,  // SEQUENCE (10 bytes)
      0x06, 0x08,  // OBJECT IDENTIFIER (8 bytes)
      0x2a, 0x86, 0x48, 0xce, 0x3d, 0x04, 0x03, 0x03,
  };
  // clang-format on
  EXPECT_EQ(ParseSignatureAlgorithm(der::Input(kData)),
            SignatureAlgorithm::kEcdsaSha384);
}